

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O1

void Saig_MvPrintState(int Iter,Saig_MvMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  printf("%3d : ",Iter);
  pVVar1 = p->vFlops;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      if (*(uint *)((long)pVVar1->pArray[lVar2] + 8) >> 3 == 0x1ffffffe) {
        printf("    *");
      }
      else {
        printf("%5d");
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->vFlops;
    } while (lVar2 < pVVar1->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Saig_MvPrintState( int Iter, Saig_MvMan_t * p )
{
    Saig_MvObj_t * pEntry;
    int i;
    printf( "%3d : ", Iter );
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
    {
        if ( pEntry->Value == SAIG_UNDEF_VALUE )
            printf( "    *" );
        else
            printf( "%5d", pEntry->Value );
    }
    printf( "\n" );
}